

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

void uv__udp_io(uv_loop_t *loop,uv__io_t *w,uint revents)

{
  uint *handle_00;
  uv_udp_t *handle;
  uint revents_local;
  uv__io_t *w_local;
  uv_loop_t *loop_local;
  
  handle_00 = &w[-3].pevents;
  if (*(int *)&w[-2].cb == 0xf) {
    if ((revents & 1) != 0) {
      uv__udp_recvmsg((uv_udp_t *)handle_00);
    }
    if ((revents & 4) != 0) {
      uv__udp_sendmsg((uv_udp_t *)handle_00);
      uv__udp_run_completed((uv_udp_t *)handle_00);
    }
    return;
  }
  __assert_fail("handle->type == UV_UDP",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/udp.c"
                ,0x8c,"void uv__udp_io(uv_loop_t *, uv__io_t *, unsigned int)");
}

Assistant:

static void uv__udp_io(uv_loop_t* loop, uv__io_t* w, unsigned int revents) {
  uv_udp_t* handle;

  handle = container_of(w, uv_udp_t, io_watcher);
  assert(handle->type == UV_UDP);

  if (revents & POLLIN)
    uv__udp_recvmsg(handle);

  if (revents & POLLOUT) {
    uv__udp_sendmsg(handle);
    uv__udp_run_completed(handle);
  }
}